

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

void * crn_compress(crn_comp_params *comp_params,crn_uint32 *compressed_size,
                   crn_uint32 *pActual_quality_level,float *pActual_bitrate)

{
  bool bVar1;
  uint uVar2;
  undefined1 local_40 [8];
  vector<unsigned_char> crn_file_data;
  float *pActual_bitrate_local;
  crn_uint32 *pActual_quality_level_local;
  crn_uint32 *compressed_size_local;
  crn_comp_params *comp_params_local;
  
  *compressed_size = 0;
  if (pActual_quality_level != (crn_uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  crn_file_data._8_8_ = pActual_bitrate;
  bVar1 = crn_comp_params::check(comp_params);
  if (bVar1) {
    crnlib::vector<unsigned_char>::vector((vector<unsigned_char> *)local_40);
    bVar1 = crnlib::create_compressed_texture
                      (comp_params,(vector<unsigned_char> *)local_40,pActual_quality_level,
                       (float *)crn_file_data._8_8_);
    if (bVar1) {
      uVar2 = crnlib::vector<unsigned_char>::size((vector<unsigned_char> *)local_40);
      *compressed_size = uVar2;
      comp_params_local =
           (crn_comp_params *)
           crnlib::vector<unsigned_char>::assume_ownership((vector<unsigned_char> *)local_40);
    }
    else {
      comp_params_local = (crn_comp_params *)0x0;
    }
    crnlib::vector<unsigned_char>::~vector((vector<unsigned_char> *)local_40);
  }
  else {
    comp_params_local = (crn_comp_params *)0x0;
  }
  return comp_params_local;
}

Assistant:

void* crn_compress(const crn_comp_params& comp_params, crn_uint32& compressed_size, crn_uint32* pActual_quality_level, float* pActual_bitrate)
{
    compressed_size = 0;
    if (pActual_quality_level)
    {
        *pActual_quality_level = 0;
    }
    if (pActual_bitrate)
    {
        *pActual_bitrate = 0.0f;
    }

    if (!comp_params.check())
    {
        return nullptr;
    }

    crnlib::vector<uint8> crn_file_data;
    if (!create_compressed_texture(comp_params, crn_file_data, pActual_quality_level, pActual_bitrate))
    {
        return nullptr;
    }

    compressed_size = crn_file_data.size();
    return crn_file_data.assume_ownership();
}